

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::
DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,pair<Kernel::TermSpec,_Kernel::TermSpec> *key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  ulong uVar6;
  int iVar7;
  
  if (this->_capacity == 0) {
    pEVar5 = (Entry *)0x0;
  }
  else {
    uVar2 = DefaultHash::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
    uVar6 = (ulong)uVar2 % (ulong)(uint)this->_capacity;
    uVar2 = this->_entries[uVar6].field_0._infoData;
    pEVar5 = (Entry *)0x0;
    if (uVar2 >> 2 == this->_timestamp) {
      pEVar4 = this->_entries + uVar6;
      if (((((pEVar4->_key).first.term._content == (key->first).term._content) &&
           ((pEVar4->_key).first.index == (key->first).index)) &&
          ((pEVar4->_key).second.term._content == (key->second).term._content)) &&
         ((pEVar4->_key).second.index == (key->second).index)) {
        pEVar5 = (Entry *)0x0;
        if ((uVar2 & 1) == 0) {
          pEVar5 = pEVar4;
        }
      }
      else if ((uVar2 & 2) == 0) {
        pEVar5 = (Entry *)0x0;
      }
      else {
        uVar3 = DefaultHash2::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
        uVar2 = this->_capacity;
        bVar1 = false;
        iVar7 = uVar3 % uVar2 + (uint)(uVar3 % uVar2 == 0);
        pEVar4 = this->_entries;
        uVar6 = (ulong)(uint)((int)uVar6 + iVar7) % (ulong)uVar2;
        pEVar5 = pEVar4 + uVar6;
        uVar3 = pEVar4[uVar6].field_0._infoData;
        if (uVar3 >> 2 == this->_timestamp) {
          bVar1 = false;
          do {
            if ((((pEVar5->_key).first.term._content == (key->first).term._content) &&
                ((pEVar5->_key).first.index == (key->first).index)) &&
               (((pEVar5->_key).second.term._content == (key->second).term._content &&
                ((pEVar5->_key).second.index == (key->second).index)))) {
              bVar1 = true;
              break;
            }
            uVar6 = (ulong)(uint)((int)uVar6 + iVar7) % (ulong)uVar2;
            pEVar5 = pEVar4 + uVar6;
            uVar3 = pEVar4[uVar6].field_0._infoData;
          } while (uVar3 >> 2 == this->_timestamp);
        }
        if ((uVar3 & 1) != 0) {
          pEVar5 = (Entry *)0x0;
        }
        if (!bVar1) {
          pEVar5 = (Entry *)0x0;
        }
      }
    }
  }
  return pEVar5;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }